

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

Node * __thiscall llvm::yaml::KeyValueNode::getValue(KeyValueNode *this)

{
  TokenKind TVar1;
  Node *pNVar2;
  Token *pTVar3;
  Document *pDVar4;
  undefined1 local_70 [56];
  Twine local_38;
  
  if (this->Value != (Node *)0x0) {
    return this->Value;
  }
  pNVar2 = getKey(this);
  if (pNVar2 == (Node *)0x0) {
    Twine::Twine(&local_38,"Null key in Key Value.");
    pTVar3 = Node::peekNext(&this->super_Node);
LAB_00dcaf3b:
    Node::setError(&this->super_Node,&local_38,pTVar3);
LAB_00dcaf40:
    pDVar4 = (((this->super_Node).Doc)->_M_t).
             super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
             ._M_t.
             super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
             .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl;
LAB_00dcaf47:
    pNVar2 = (Node *)Node::operator_new(0x48,&pDVar4->NodeAllocator,0x10);
    if (pNVar2 == (Node *)0x0) goto LAB_00dcaf6a;
  }
  else {
    (*pNVar2->_vptr_Node[1])(pNVar2);
    pDVar4 = (((this->super_Node).Doc)->_M_t).
             super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
             ._M_t.
             super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
             .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl;
    if (*(char *)(*(long *)&pDVar4->stream->scanner + 0x4a) == '\x01') goto LAB_00dcaf47;
    pTVar3 = Node::peekNext(&this->super_Node);
    TVar1 = pTVar3->Kind;
    if (TK_Value < TVar1) {
LAB_00dcaf7c:
      Twine::Twine(&local_38,"Unexpected token in Key Value.");
      goto LAB_00dcaf3b;
    }
    if ((0x18901U >> (TVar1 & (TK_Key|TK_FlowMappingEnd)) & 1) != 0) goto LAB_00dcaf40;
    if (TVar1 != TK_Value) goto LAB_00dcaf7c;
    Node::getNext((Token *)local_70,&this->super_Node);
    std::__cxx11::string::~string((string *)(local_70 + 0x18));
    pTVar3 = Node::peekNext(&this->super_Node);
    if ((pTVar3->Kind != TK_Key) && (pTVar3->Kind != TK_BlockEnd)) {
      pNVar2 = Node::parseBlockNode(&this->super_Node);
      goto LAB_00dcaf6a;
    }
    pNVar2 = (Node *)Node::operator_new(0x48,&((((this->super_Node).Doc)->_M_t).
                                               super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                               .super__Head_base<0UL,_llvm::yaml::Document_*,_false>
                                              ._M_head_impl)->NodeAllocator,0x10);
    if (pNVar2 == (Node *)0x0) {
      pNVar2 = (Node *)0x0;
      goto LAB_00dcaf6a;
    }
  }
  NullNode::NullNode((NullNode *)pNVar2,(this->super_Node).Doc);
LAB_00dcaf6a:
  this->Value = pNVar2;
  return pNVar2;
}

Assistant:

Node *KeyValueNode::getValue() {
  if (Value)
    return Value;

  if (Node* Key = getKey())
    Key->skip();
  else {
    setError("Null key in Key Value.", peekNext());
    return Value = new (getAllocator()) NullNode(Doc);
  }

  if (failed())
    return Value = new (getAllocator()) NullNode(Doc);

  // Handle implicit null values.
  {
    Token &t = peekNext();
    if (   t.Kind == Token::TK_BlockEnd
        || t.Kind == Token::TK_FlowMappingEnd
        || t.Kind == Token::TK_Key
        || t.Kind == Token::TK_FlowEntry
        || t.Kind == Token::TK_Error) {
      return Value = new (getAllocator()) NullNode(Doc);
    }

    if (t.Kind != Token::TK_Value) {
      setError("Unexpected token in Key Value.", t);
      return Value = new (getAllocator()) NullNode(Doc);
    }
    getNext(); // skip TK_Value.
  }

  // Handle explicit null values.
  Token &t = peekNext();
  if (t.Kind == Token::TK_BlockEnd || t.Kind == Token::TK_Key) {
    return Value = new (getAllocator()) NullNode(Doc);
  }

  // We got a normal value.
  return Value = parseBlockNode();
}